

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

StringView __thiscall Corrade::Containers::String::findLast(String *this,StringView substring)

{
  char *begin;
  ulong substringSize;
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_28;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_28,this);
  substringSize = substring._sizePlusFlags & 0x3fffffffffffffff;
  begin = Implementation::stringFindLastString
                    (local_28._data,local_28._sizePlusFlags & 0x3fffffffffffffff,substring._data,
                     substringSize);
  if (begin == (char *)0x0) {
    BVar1 = (BasicStringView<const_char>)ZEXT816(0);
  }
  else {
    BVar1 = BasicStringView<const_char>::slice(&local_28,begin,begin + substringSize);
  }
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findLast(const StringView substring) const {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return StringView{*this}.findLastOr(substring, nullptr);
}